

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr root)

{
  uint uVar1;
  uint local_4c;
  xmlChar *pxStack_48;
  int ret;
  xmlChar *value;
  xmlNsPtr ns;
  xmlAttrPtr attr;
  xmlNodePtr elem;
  xmlNodePtr root_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  local_4c = 1;
  if (((root == (xmlNodePtr)0x0) || (doc == (xmlDocPtr)0x0)) ||
     ((attr = (xmlAttrPtr)root, doc->intSubset == (_xmlDtd *)0x0 &&
      (doc->extSubset == (_xmlDtd *)0x0)))) {
    return 0;
  }
  do {
    while( true ) {
      uVar1 = xmlValidateOneElement(ctxt,doc,(xmlNodePtr)attr);
      local_4c = uVar1 & local_4c;
      if (attr->type == XML_ELEMENT_NODE) break;
LAB_0017d3b9:
      while( true ) {
        if ((xmlNodePtr)attr == root) {
          return local_4c;
        }
        if (attr->next != (_xmlAttr *)0x0) break;
        attr = (xmlAttrPtr)attr->parent;
      }
      attr = attr->next;
    }
    for (ns = (xmlNsPtr)attr->psvi; ns != (xmlNsPtr)0x0; ns = ns[1].next) {
      if (ns->prefix == (xmlChar *)0x0) {
        pxStack_48 = xmlStrdup("");
      }
      else {
        pxStack_48 = xmlNodeListGetString(doc,(xmlNode *)ns->prefix,0);
      }
      if (pxStack_48 == (xmlChar *)0x0) {
        xmlVErrMemory(ctxt);
        local_4c = 0;
      }
      else {
        uVar1 = xmlValidateOneAttribute(ctxt,doc,(xmlNodePtr)attr,(xmlAttrPtr)ns,pxStack_48);
        local_4c = uVar1 & local_4c;
        (*xmlFree)(pxStack_48);
      }
    }
    for (value = (xmlChar *)attr->id; value != (xmlChar *)0x0; value = *(xmlChar **)value) {
      if (attr->ns == (xmlNs *)0x0) {
        uVar1 = xmlValidateOneNamespace
                          (ctxt,doc,(xmlNodePtr)attr,(xmlChar *)0x0,(xmlNsPtr)value,
                           *(xmlChar **)(value + 0x10));
      }
      else {
        uVar1 = xmlValidateOneNamespace
                          (ctxt,doc,(xmlNodePtr)attr,attr->ns->prefix,(xmlNsPtr)value,
                           *(xmlChar **)(value + 0x10));
      }
      local_4c = uVar1 & local_4c;
    }
    if (attr->children == (_xmlNode *)0x0) goto LAB_0017d3b9;
    attr = (xmlAttrPtr)attr->children;
  } while( true );
}

Assistant:

int
xmlValidateElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc, xmlNodePtr root) {
    xmlNodePtr elem;
    xmlAttrPtr attr;
    xmlNsPtr ns;
    const xmlChar *value;
    int ret = 1;

    if (root == NULL) return(0);

    CHECK_DTD;

    elem = root;
    while (1) {
        ret &= xmlValidateOneElement(ctxt, doc, elem);

        if (elem->type == XML_ELEMENT_NODE) {
            attr = elem->properties;
            while (attr != NULL) {
                if (attr->children == NULL)
                    value = xmlStrdup(BAD_CAST "");
                else
                    value = xmlNodeListGetString(doc, attr->children, 0);
                if (value == NULL) {
                    xmlVErrMemory(ctxt);
                    ret = 0;
                } else {
                    ret &= xmlValidateOneAttribute(ctxt, doc, elem, attr, value);
                    xmlFree((char *)value);
                }
                attr= attr->next;
            }

            ns = elem->nsDef;
            while (ns != NULL) {
                if (elem->ns == NULL)
                    ret &= xmlValidateOneNamespace(ctxt, doc, elem, NULL,
                                                   ns, ns->href);
                else
                    ret &= xmlValidateOneNamespace(ctxt, doc, elem,
                                                   elem->ns->prefix, ns,
                                                   ns->href);
                ns = ns->next;
            }

            if (elem->children != NULL) {
                elem = elem->children;
                continue;
            }
        }

        while (1) {
            if (elem == root)
                goto done;
            if (elem->next != NULL)
                break;
            elem = elem->parent;
        }
        elem = elem->next;
    }

done:
    return(ret);
}